

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdblobimpl.h
# Opt level: O0

bool __thiscall SQBlob::GrowBufOf(SQBlob *this,SQInteger n)

{
  long lVar1;
  long lVar2;
  long in_RSI;
  long in_RDI;
  bool ret;
  undefined7 in_stack_ffffffffffffffe8;
  bool bVar3;
  
  bVar3 = true;
  if (*(long *)(in_RDI + 0x10) < *(long *)(in_RDI + 8) + in_RSI) {
    lVar1 = *(long *)(in_RDI + 8) + in_RSI;
    lVar2 = *(long *)(in_RDI + 8) * 2;
    if (lVar1 == lVar2 || SBORROW8(lVar1,lVar2) != lVar1 + *(long *)(in_RDI + 8) * -2 < 0) {
      bVar3 = Resize((SQBlob *)CONCAT17(1,in_stack_ffffffffffffffe8),in_RDI);
    }
    else {
      bVar3 = Resize((SQBlob *)CONCAT17(1,in_stack_ffffffffffffffe8),in_RDI);
    }
  }
  *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + in_RSI;
  return bVar3;
}

Assistant:

bool GrowBufOf(SQInteger n)
    {
        bool ret = true;
        if(_size + n > _allocated) {
            if(_size + n > _size * 2)
                ret = Resize(_size + n);
            else
                ret = Resize(_size * 2);
        }
        _size = _size + n;
        return ret;
    }